

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O2

UBool isSpecialTypeRgKeyValue(char *val)

{
  byte c;
  UBool UVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    c = val[lVar2];
    if (c == 0) {
      return (uint)lVar2 == 6;
    }
    if ((uint)lVar2 < 2) {
      UVar1 = uprv_isASCIILetter_63(c);
      if (UVar1 == '\0') {
        return '\0';
      }
    }
    else if ((c | 0x20) != 0x7a) {
      return '\0';
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static UBool
isSpecialTypeRgKeyValue(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if ( (subtagLen < 2 && uprv_isASCIILetter(*p)) ||
                    (subtagLen >= 2 && (*p == 'Z' || *p == 'z')) ) {
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen == 6);
}